

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void test_aad_ciphersuite(ptls_cipher_suite_t *cs1,ptls_cipher_suite_t *cs2)

{
  int iVar1;
  ptls_aead_context_t *ppVar2;
  size_t sVar3;
  size_t sVar4;
  size_t __n;
  char enc [256];
  char dec [256];
  
  ppVar2 = ptls_aead_new(cs1->aead,cs1->hash,1,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar2 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                  0xb2,"void test_aad_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
  }
  ptls_aead_encrypt_init(ppVar2,0x7b,"my true aad",0xb);
  sVar3 = (*ppVar2->do_encrypt_update)(ppVar2,enc,"hello world",0xb);
  sVar4 = (*ppVar2->do_encrypt_final)(ppVar2,enc + sVar3);
  ptls_aead_free(ppVar2);
  ppVar2 = ptls_aead_new(cs2->aead,cs2->hash,0,"012345678901234567890123456789012345678901234567",
                         (char *)0x0);
  if (ppVar2 != (ptls_aead_context_t *)0x0) {
    __n = ptls_aead_decrypt(ppVar2,dec,enc,sVar4 + sVar3,0x7b,"my true aad",0xb);
    _ok((uint)(__n == 0xb),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xbc);
    iVar1 = bcmp("hello world",dec,__n);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xbd);
    sVar3 = ptls_aead_decrypt(ppVar2,dec,enc,sVar4 + sVar3,0x7b,"my fake aad",0xb);
    _ok((uint)(sVar3 == 0xffffffffffffffff),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xbf);
    ptls_aead_free(ppVar2);
    return;
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
                0xba,"void test_aad_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_aad_ciphersuite(ptls_cipher_suite_t *cs1, ptls_cipher_suite_t *cs2)
{
    const char *traffic_secret = "012345678901234567890123456789012345678901234567", *src = "hello world", *aad = "my true aad";
    ptls_aead_context_t *c;
    char enc[256], dec[256];
    size_t enclen, declen;

    /* encrypt */
    c = ptls_aead_new(cs1->aead, cs1->hash, 1, traffic_secret, NULL);
    assert(c != NULL);
    ptls_aead_encrypt_init(c, 123, aad, strlen(aad));
    enclen = ptls_aead_encrypt_update(c, enc, src, strlen(src));
    enclen += ptls_aead_encrypt_final(c, enc + enclen);
    ptls_aead_free(c);

    /* decrypt */
    c = ptls_aead_new(cs2->aead, cs2->hash, 0, traffic_secret, NULL);
    assert(c != NULL);
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, aad, strlen(aad));
    ok(declen == strlen(src));
    ok(memcmp(src, dec, declen) == 0);
    declen = ptls_aead_decrypt(c, dec, enc, enclen, 123, "my fake aad", strlen(aad));
    ok(declen == SIZE_MAX);
    ptls_aead_free(c);
}